

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall
ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper
          (ON__CChangeTextureCoordinateHelper *this,ON_Mesh *mesh,int newvcnt,float **mesh_T)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ON_2fPoint *pOVar4;
  bool *pbVar5;
  ON_3fPoint *pOVar6;
  ON_TextureCoordinates *local_60;
  ON_3fPoint *local_58;
  float *p_1;
  ON_TextureCoordinates *tc;
  int tccount;
  int tci;
  float *p;
  int vcnt;
  float **local_28;
  float **mesh_T_local;
  ON_Mesh *pOStack_18;
  int newvcnt_local;
  ON_Mesh *mesh_local;
  ON__CChangeTextureCoordinateHelper *this_local;
  
  this->m_mesh = mesh;
  this->m_mesh_dV = (ON_3dPointArray *)0x0;
  local_28 = mesh_T;
  mesh_T_local._4_4_ = newvcnt;
  pOStack_18 = mesh;
  mesh_local = (ON_Mesh *)this;
  ON_SimpleArray<ON_TextureCoordinates_*>::ON_SimpleArray(&this->m_TC);
  this->m_vuse_count = 0;
  ON_SimpleArray<unsigned_int>::ON_SimpleArray(&this->m_vuse);
  ON_Mesh::DestroyTopology(this->m_mesh);
  ON_Mesh::DestroyPartition(this->m_mesh);
  ON_Mesh::DestroyTree(this->m_mesh,true);
  this->m_tci = -1;
  p._0_4_ = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>)
  ;
  ON_SimpleArray<ON_3fPoint>::Reserve
            (&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>,
             (long)((int)p + mesh_T_local._4_4_));
  bVar2 = ON_Mesh::HasDoublePrecisionVertices(this->m_mesh);
  if (bVar2) {
    this->m_mesh_dV = &this->m_mesh->m_dV;
    ON_SimpleArray<ON_3dPoint>::Reserve
              (&this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint>,
               (long)((int)p + mesh_T_local._4_4_));
  }
  else {
    ON_Mesh::DestroyDoublePrecisionVertices(this->m_mesh);
  }
  bVar2 = ON_Mesh::HasVertexNormals(this->m_mesh);
  this->m_bHasVertexNormals = bVar2;
  if ((this->m_bHasVertexNormals & 1U) != 0) {
    ON_SimpleArray<ON_3fVector>::Reserve
              (&(this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>,
               (long)((int)p + mesh_T_local._4_4_));
  }
  bVar2 = ON_Mesh::HasTextureCoordinates(this->m_mesh);
  this->m_bHasVertexTextures = bVar2;
  if ((this->m_bHasVertexTextures & 1U) != 0) {
    _tccount = ON_SimpleArray<ON_2fPoint>::Array
                         (&(this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
    ON_SimpleArray<ON_2fPoint>::Reserve
              (&(this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,
               (long)((int)p + mesh_T_local._4_4_));
    if (_tccount == (ON_2fPoint *)*local_28) {
      pOVar4 = ON_SimpleArray<ON_2fPoint>::Array
                         (&(this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
      *local_28 = &pOVar4->x;
    }
  }
  bVar2 = ON_Mesh::HasVertexColors(this->m_mesh);
  this->m_bHasVertexColors = bVar2;
  if ((this->m_bHasVertexColors & 1U) != 0) {
    ON_SimpleArray<ON_Color>::Reserve(&this->m_mesh->m_C,(long)((int)p + mesh_T_local._4_4_));
  }
  bVar2 = ON_Mesh::HasSurfaceParameters(this->m_mesh);
  this->m_bHasSurfaceParameters = bVar2;
  if ((this->m_bHasSurfaceParameters & 1U) != 0) {
    ON_SimpleArray<ON_2dPoint>::Reserve
              (&(this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,
               (long)((int)p + mesh_T_local._4_4_));
  }
  bVar2 = ON_Mesh::HasPrincipalCurvatures(this->m_mesh);
  this->m_bHasPrincipalCurvatures = bVar2;
  if ((this->m_bHasPrincipalCurvatures & 1U) != 0) {
    ON_SimpleArray<ON_SurfaceCurvature>::Reserve
              (&this->m_mesh->m_K,(long)((int)p + mesh_T_local._4_4_));
  }
  pbVar5 = ON_Mesh::HiddenVertexArray(this->m_mesh);
  this->m_bHasHiddenVertices = pbVar5 != (bool *)0x0;
  if ((this->m_bHasHiddenVertices & 1U) != 0) {
    ON_SimpleArray<bool>::Reserve(&this->m_mesh->m_H,(long)((int)p + mesh_T_local._4_4_));
  }
  this->m_bHasCachedTextures = false;
  tc._0_4_ = ON_ClassArray<ON_TextureCoordinates>::Count(&this->m_mesh->m_TC);
  ON_SimpleArray<ON_TextureCoordinates_*>::Reserve(&this->m_TC,(long)(int)tc);
  for (tc._4_4_ = 0; tc._4_4_ < (int)tc; tc._4_4_ = tc._4_4_ + 1) {
    p_1 = (float *)ON_ClassArray<ON_TextureCoordinates>::operator[](&this->m_mesh->m_TC,tc._4_4_);
    iVar1 = (int)p;
    iVar3 = ON_SimpleArray<ON_3fPoint>::Count(&((ON_TextureCoordinates *)p_1)->m_T);
    if (iVar1 == iVar3) {
      this->m_bHasCachedTextures = true;
      local_58 = ON_SimpleArray<ON_3fPoint>::Array((ON_SimpleArray<ON_3fPoint> *)(p_1 + 0x28));
      ON_SimpleArray<ON_3fPoint>::Reserve
                ((ON_SimpleArray<ON_3fPoint> *)(p_1 + 0x28),(long)((int)p + mesh_T_local._4_4_));
      if (local_58 == (ON_3fPoint *)*local_28) {
        pOVar6 = ON_SimpleArray<ON_3fPoint>::Array((ON_SimpleArray<ON_3fPoint> *)(p_1 + 0x28));
        *local_28 = &pOVar6->x;
      }
      local_60 = (ON_TextureCoordinates *)p_1;
      ON_SimpleArray<ON_TextureCoordinates_*>::Append(&this->m_TC,&local_60);
    }
  }
  return;
}

Assistant:

ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper(
    ON_Mesh& mesh,
    int newvcnt,
    float*& mesh_T )
: m_mesh(mesh)
, m_mesh_dV(0)
, m_vuse_count(0)
{
  // adding vertices invalidates this cached information.
  m_mesh.DestroyTopology();
  m_mesh.DestroyPartition();
  m_mesh.DestroyTree();

  m_tci = -1;

  const int vcnt = m_mesh.m_V.Count();

  // It is critical to reserve enough room in the arrays
  // before duplication starts.  Otherwise, during duplication,
  // a dynamic array can be reallocated, which will make
  // saved array base pointers will be invalid, and you crash
  // the next time they are used.

  m_mesh.m_V.Reserve(vcnt+newvcnt);

  if ( m_mesh.HasDoublePrecisionVertices() )
  {
    m_mesh_dV = &m_mesh.m_dV;
    m_mesh_dV->Reserve(vcnt+newvcnt);
  }
  else
  {
    m_mesh.DestroyDoublePrecisionVertices();
  }

  m_bHasVertexNormals = m_mesh.HasVertexNormals();
  if ( m_bHasVertexNormals )
    m_mesh.m_N.Reserve(vcnt+newvcnt);

  m_bHasVertexTextures = m_mesh.HasTextureCoordinates();
  if ( m_bHasVertexTextures )
  {
    float* p = (float*)m_mesh.m_T.Array();
    m_mesh.m_T.Reserve(vcnt+newvcnt);
    if ( p == mesh_T )
      mesh_T = (float*)m_mesh.m_T.Array();
  }

  m_bHasVertexColors = m_mesh.HasVertexColors();
  if ( m_bHasVertexColors )
    m_mesh.m_C.Reserve(vcnt+newvcnt);

  m_bHasSurfaceParameters = m_mesh.HasSurfaceParameters();
  if ( m_bHasSurfaceParameters )
    m_mesh.m_S.Reserve(vcnt+newvcnt);

  m_bHasPrincipalCurvatures = m_mesh.HasPrincipalCurvatures();
  if ( m_bHasPrincipalCurvatures )
    m_mesh.m_K.Reserve(vcnt+newvcnt);

  m_bHasHiddenVertices = (0 != m_mesh.HiddenVertexArray());
  if ( m_bHasHiddenVertices )
    m_mesh.m_H.Reserve(vcnt+newvcnt);

  // Set m_TC[] to be the subset of m_mesh.m_TC[] that is
  // valid for duplication.
  m_bHasCachedTextures = false;
  int tci, tccount = m_mesh.m_TC.Count();
  m_TC.Reserve(tccount);
  for ( tci = 0; tci < tccount; tci++ )
  {
    ON_TextureCoordinates& tc = m_mesh.m_TC[tci];
    if ( vcnt == tc.m_T.Count() )
    {
      m_bHasCachedTextures = true;
      float* p = (float*)tc.m_T.Array();
      tc.m_T.Reserve(vcnt+newvcnt);
      if ( p == mesh_T )
        mesh_T = (float*)tc.m_T.Array();
      m_TC.Append( &tc );
    }
  }
}